

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_relation_set.cpp
# Opt level: O1

JoinRelationSet * __thiscall
duckdb::JoinRelationSetManager::GetJoinRelation(JoinRelationSetManager *this,idx_t index)

{
  JoinRelationSet *pJVar1;
  pointer *__ptr;
  _Head_base<0UL,_unsigned_long_*,_false> local_18;
  
  local_18._M_head_impl = (unsigned_long *)operator_new__(8);
  *local_18._M_head_impl = index;
  pJVar1 = GetJoinRelation(this,(unsafe_unique_array<idx_t> *)&local_18,1);
  if (local_18._M_head_impl != (idx_t *)0x0) {
    operator_delete__(local_18._M_head_impl);
  }
  return pJVar1;
}

Assistant:

JoinRelationSet &JoinRelationSetManager::GetJoinRelation(idx_t index) {
	// create a sorted vector of the relations
	auto relations = make_unsafe_uniq_array<idx_t>(1);
	relations[0] = index;
	idx_t count = 1;
	return GetJoinRelation(std::move(relations), count);
}